

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

size_t axl::err::pushFormatError_va(Guid *guid,uint_t code,char *formatString,axl_va_list *va)

{
  size_t sVar1;
  axl_va_list *in_stack_00000028;
  char *in_stack_00000030;
  uint_t in_stack_0000003c;
  Guid *in_stack_00000040;
  Error *in_stack_00000048;
  size_t result;
  Error error;
  axl_va_list *in_stack_ffffffffffffff48;
  axl_va_list *in_stack_ffffffffffffff50;
  undefined8 local_a8;
  ErrorRef *in_stack_ffffffffffffffb0;
  
  Error::Error((Error *)0x131e68);
  axl_va_list::axl_va_list(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  sVar1 = Error::format_va(in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000030,
                           in_stack_00000028);
  axl_va_list::~axl_va_list((axl_va_list *)0x131ecf);
  if (sVar1 == 0xffffffffffffffff) {
    local_a8 = 0xffffffffffffffff;
  }
  else {
    local_a8 = pushError(in_stack_ffffffffffffffb0);
  }
  Error::~Error((Error *)0x131f26);
  return local_a8;
}

Assistant:

size_t
pushFormatError_va(
	const sl::Guid& guid,
	uint_t code,
	const char* formatString,
	axl_va_list va
) {
	Error error;
	size_t result = error.format_va(guid, code, formatString, va);
	return result != -1 ? pushError(error) : -1;
}